

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trie.hpp
# Opt level: O1

DictUnit * __thiscall cppjieba::Trie::Find(Trie *this,const_iterator begin,const_iterator end)

{
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_std::allocator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this_00;
  TrieNode *pTVar1;
  __node_base_ptr p_Var2;
  _Hash_node_base *p_Var3;
  DictUnit *pDVar4;
  const_iterator it;
  
  if (begin == end) {
    pDVar4 = (DictUnit *)0x0;
  }
  else {
    pTVar1 = this->root_;
    do {
      this_00 = &pTVar1->next->_M_h;
      if (this_00 ==
          (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_std::allocator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           *)0x0) {
        return (DictUnit *)0x0;
      }
      p_Var2 = std::
               _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_std::allocator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::_M_find_before_node
                         (this_00,(ulong)begin->rune % this_00->_M_bucket_count,&begin->rune,
                          (ulong)begin->rune);
      p_Var3 = (_Hash_node_base *)0x0;
      if (p_Var2 != (__node_base_ptr)0x0) {
        p_Var3 = p_Var2->_M_nxt;
      }
      if (p_Var3 == (_Hash_node_base *)0x0) {
        return (DictUnit *)0x0;
      }
      begin = begin + 1;
      pTVar1 = (TrieNode *)p_Var3[2]._M_nxt;
    } while (begin != end);
    pDVar4 = pTVar1->ptValue;
  }
  return pDVar4;
}

Assistant:

const DictUnit* Find(RuneStrArray::const_iterator begin, RuneStrArray::const_iterator end) const {
    if (begin == end) {
      return NULL;
    }

    const TrieNode* ptNode = root_;
    TrieNode::NextMap::const_iterator citer;
    for (RuneStrArray::const_iterator it = begin; it != end; it++) {
      if (NULL == ptNode->next) {
        return NULL;
      }
      citer = ptNode->next->find(it->rune);
      if (ptNode->next->end() == citer) {
        return NULL;
      }
      ptNode = citer->second;
    }
    return ptNode->ptValue;
  }